

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_36::HttpOutputStream::pumpBodyFrom
          (HttpOutputStream *this,AsyncInputStream *input,uint64_t amount)

{
  Own<kj::_::ForkHub<kj::_::Void>,_std::nullptr_t> *this_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this_01;
  byte bVar1;
  SourceLocation location;
  Coroutine<unsigned_long> *coroutine;
  bool bVar2;
  coroutine_handle<void> handle;
  unsigned_long value;
  undefined8 in_RCX;
  PromiseAwaiter<unsigned_long> *__return_storage_ptr__;
  DebugExpression<bool> _kjCondition;
  Fault f;
  Fault local_60;
  char *local_58;
  char *pcStack_50;
  _func_int **local_48;
  Coroutine<unsigned_long> *local_40;
  PromiseBase local_38;
  
  handle._M_fr_ptr = operator_new(0x638);
  *(code **)handle._M_fr_ptr = pumpBodyFrom;
  *(code **)((long)handle._M_fr_ptr + 8) = pumpBodyFrom;
  *(undefined8 *)((long)handle._M_fr_ptr + 0x628) = in_RCX;
  *(uint64_t *)((long)handle._M_fr_ptr + 0x620) = amount;
  *(AsyncInputStream **)((long)handle._M_fr_ptr + 0x618) = input;
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  pcStack_50 = "pumpBodyFrom";
  local_48 = (_func_int **)0x1500000906;
  location.function = "pumpBodyFrom";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x906;
  location.columnNumber = 0x15;
  kj::_::Coroutine<unsigned_long>::Coroutine
            ((Coroutine<unsigned_long> *)((long)handle._M_fr_ptr + 0x10),handle,location);
  local_40 = (Coroutine<unsigned_long> *)((long)handle._M_fr_ptr + 0x10);
  local_38.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  kj::_::Coroutine<unsigned_long>::get_return_object((Coroutine<unsigned_long> *)this);
  coroutine = local_40;
  bVar1 = *(byte *)((long)&input[3]._vptr_AsyncInputStream + 2);
  local_60.exception._0_1_ = bVar1 ^ 1;
  if (bVar1 != 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[32]>
              ((Fault *)&stack0xffffffffffffffa8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x907,FAILED,"!writeInProgress","_kjCondition,\"concurrent write()s not allowed\"",
               (DebugExpression<bool> *)&local_60,(char (*) [32])"concurrent write()s not allowed");
    kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffffa8);
  }
  local_58 = (char *)(input + 3);
  if (*(char *)&input[3]._vptr_AsyncInputStream != '\0') {
    this_00 = (Own<kj::_::ForkHub<kj::_::Void>,_std::nullptr_t> *)((long)handle._M_fr_ptr + 0x600);
    *(undefined1 *)((long)&input[3]._vptr_AsyncInputStream + 2) = 1;
    *(char **)((long)handle._M_fr_ptr + 0x5e8) =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    *(char **)((long)handle._M_fr_ptr + 0x5f0) = "pumpBodyFrom";
    *(undefined8 *)((long)handle._M_fr_ptr + 0x5f8) = 0x110000090b;
    Promise<void>::fork((Promise<void> *)this_00);
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)&stack0xffffffffffffffa8);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(input + 2),
               (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xffffffffffffffa8);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xffffffffffffffa8);
    kj::_::ForkedPromiseAwaiter<void>::ForkedPromiseAwaiter
              ((ForkedPromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x240),
               (ForkedPromise<void> *)this_00);
    *(undefined1 *)((long)handle._M_fr_ptr + 0x630) = 0;
    bVar2 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)((long)handle._M_fr_ptr + 0x270),
                       &coroutine->super_CoroutineBase);
    if (!bVar2) {
      kj::_::PromiseAwaiter<void>::await_resume
                ((PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x270));
      kj::_::ForkedPromiseAwaiter<void>::~ForkedPromiseAwaiter
                ((ForkedPromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x240));
      this_01 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x610);
      (**(code **)(**(long **)((long)handle._M_fr_ptr + 0x620) + 0x18))
                (this_01,*(long **)((long)handle._M_fr_ptr + 0x620),
                 *(undefined8 *)(*(long *)((long)handle._M_fr_ptr + 0x618) + 8),
                 *(undefined8 *)((long)handle._M_fr_ptr + 0x628));
      __return_storage_ptr__ = (PromiseAwaiter<unsigned_long> *)((long)handle._M_fr_ptr + 0x428);
      co_await<unsigned_long>(__return_storage_ptr__,(Promise<unsigned_long> *)this_01);
      *(undefined1 *)((long)handle._M_fr_ptr + 0x630) = 1;
      bVar2 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                        ((PromiseAwaiterBase *)__return_storage_ptr__,
                         &coroutine->super_CoroutineBase);
      if (!bVar2) {
        value = kj::_::PromiseAwaiter<unsigned_long>::await_resume(__return_storage_ptr__);
        kj::_::PromiseAwaiter<unsigned_long>::~PromiseAwaiter(__return_storage_ptr__);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(this_01);
        *(undefined1 *)(*(long *)((long)handle._M_fr_ptr + 0x618) + 0x1a) = 0;
        kj::_::CoroutineMixin<kj::_::Coroutine<unsigned_long>,_unsigned_long>::return_value
                  ((CoroutineMixin<kj::_::Coroutine<unsigned_long>,_unsigned_long> *)coroutine,value
                  );
        Own<kj::_::ForkHub<kj::_::Void>,_std::nullptr_t>::dispose(this_00);
        *(undefined8 *)handle._M_fr_ptr = 0;
        *(undefined1 *)((long)handle._M_fr_ptr + 0x630) = 2;
      }
    }
    return (Promise<unsigned_long>)(PromiseNode *)local_38.node.ptr;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&>
            (&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x908,FAILED,"inBody","_kjCondition,",
             (DebugExpression<bool_&> *)&stack0xffffffffffffffa8);
  kj::_::Debug::Fault::fatal(&local_60);
}

Assistant:

Promise<uint64_t> pumpBodyFrom(AsyncInputStream& input, uint64_t amount) {
    KJ_REQUIRE(!writeInProgress, "concurrent write()s not allowed");
    KJ_REQUIRE(inBody);

    writeInProgress = true;
    auto fork = writeQueue.fork();
    writeQueue = fork.addBranch();

    co_await fork;
    auto actual = co_await input.pumpTo(inner, amount);

    // We intentionally don't use KJ_DEFER to clean this up because if an exception is thrown, we
    // want to block further writes.
    writeInProgress = false;
    co_return actual;
  }